

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiosXMLUtil.cpp
# Opt level: O0

unique_ptr<pugi::xml_document,_std::default_delete<pugi::xml_document>_>
adios2::helper::XMLDocument(string *xmlContents,string *hint)

{
  bool bVar1;
  string *activity;
  pointer pxVar2;
  size_t size;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  void *in_RDX;
  xml_document *in_RDI;
  xml_parse_result parse_result;
  unique_ptr<pugi::xml_document,_std::default_delete<pugi::xml_document>_> *document;
  pointer in_stack_fffffffffffffe58;
  allocator *paVar3;
  xml_document *in_stack_fffffffffffffe60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  int commRank;
  _Head_base<0UL,_pugi::xml_document_*,_false> message;
  string *in_stack_fffffffffffffeb8;
  string *in_stack_fffffffffffffec0;
  string local_120 [32];
  string local_100 [32];
  string local_e0 [39];
  undefined1 local_b9 [40];
  allocator local_91;
  string local_90 [39];
  allocator local_69;
  string local_68 [32];
  xml_parse_result local_48;
  undefined1 local_19;
  
  local_19 = 0;
  message._M_head_impl = in_RDI;
  activity = (string *)operator_new(0xd0);
  pugi::xml_document::xml_document(in_stack_fffffffffffffe60);
  std::unique_ptr<pugi::xml_document,std::default_delete<pugi::xml_document>>::
  unique_ptr<std::default_delete<pugi::xml_document>,void>
            ((unique_ptr<pugi::xml_document,_std::default_delete<pugi::xml_document>_> *)
             in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
  pxVar2 = std::unique_ptr<pugi::xml_document,_std::default_delete<pugi::xml_document>_>::operator->
                     ((unique_ptr<pugi::xml_document,_std::default_delete<pugi::xml_document>_> *)
                      0x9d322e);
  size = std::__cxx11::string::data();
  std::__cxx11::string::size();
  pugi::xml_document::load_buffer_inplace
            (in_RDI,in_RDX,size,(uint)((ulong)pxVar2 >> 0x20),(xml_encoding)pxVar2);
  commRank = (int)((ulong)in_RDI >> 0x20);
  bVar1 = pugi::xml_parse_result::operator_cast_to_bool(&local_48);
  if (!bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_68,"Helper",&local_69);
    paVar3 = &local_91;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_90,"adiosXMLUtil",paVar3);
    __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)(local_b9 + 1),"XMLDocument",(allocator *)__lhs);
    __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            pugi::xml_parse_result::description(&local_48);
    paVar3 = (allocator *)&stack0xfffffffffffffebf;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&stack0xfffffffffffffec0,(char *)__rhs,paVar3);
    std::operator+((char *)__lhs,__rhs);
    std::operator+(__lhs,(char *)__rhs);
    std::operator+(__lhs,__rhs);
    Throw<std::invalid_argument>
              (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,activity,
               (string *)message._M_head_impl,commRank);
    std::__cxx11::string::~string(local_e0);
    std::__cxx11::string::~string(local_100);
    std::__cxx11::string::~string(local_120);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffec0);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffebf);
    std::__cxx11::string::~string((string *)(local_b9 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_b9);
    std::__cxx11::string::~string(local_90);
    std::allocator<char>::~allocator((allocator<char> *)&local_91);
    std::__cxx11::string::~string(local_68);
    std::allocator<char>::~allocator((allocator<char> *)&local_69);
  }
  return (__uniq_ptr_data<pugi::xml_document,_std::default_delete<pugi::xml_document>,_true,_true>)
         (tuple<pugi::xml_document_*,_std::default_delete<pugi::xml_document>_>)message._M_head_impl
  ;
}

Assistant:

std::unique_ptr<pugi::xml_document> XMLDocument(const std::string &xmlContents,
                                                const std::string hint)
{
    std::unique_ptr<pugi::xml_document> document(new pugi::xml_document);
    auto parse_result =
        document->load_buffer_inplace(const_cast<char *>(xmlContents.data()), xmlContents.size());

    if (!parse_result)
    {
        helper::Throw<std::invalid_argument>(
            "Helper", "adiosXMLUtil", "XMLDocument",
            "parse error in XML string, description: " + std::string(parse_result.description()) +
                ", check with any XML editor if format is ill-formed, " + hint);
    }
    return document;
}